

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

void Sendrecv(IceTCommunicator self,void *sendbuf,int sendcount,IceTEnum sendtype,int dest,
             int sendtag,void *recvbuf,int recvcount,IceTEnum recvtype,int src,int recvtag)

{
  undefined *local_50;
  MPI_Datatype mpirecvtype;
  MPI_Datatype mpisendtype;
  int sendtag_local;
  int dest_local;
  IceTEnum sendtype_local;
  int sendcount_local;
  void *sendbuf_local;
  IceTCommunicator self_local;
  
  switch(sendtype) {
  case 0x8000:
    mpirecvtype = (MPI_Datatype)&ompi_mpi_byte;
    break;
  case 0x8001:
    mpirecvtype = (MPI_Datatype)&ompi_mpi_byte;
    break;
  case 0x8002:
    mpirecvtype = (MPI_Datatype)&ompi_mpi_short;
    break;
  case 0x8003:
    mpirecvtype = (MPI_Datatype)&ompi_mpi_int;
    break;
  case 0x8004:
    mpirecvtype = (MPI_Datatype)&ompi_mpi_float;
    break;
  case 0x8005:
    mpirecvtype = (MPI_Datatype)&ompi_mpi_double;
    break;
  default:
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x12e);
    mpirecvtype = (MPI_Datatype)&ompi_mpi_byte;
  }
  switch(recvtype) {
  case 0x8000:
    local_50 = &ompi_mpi_byte;
    break;
  case 0x8001:
    local_50 = &ompi_mpi_byte;
    break;
  case 0x8002:
    local_50 = &ompi_mpi_short;
    break;
  case 0x8003:
    local_50 = &ompi_mpi_int;
    break;
  case 0x8004:
    local_50 = &ompi_mpi_float;
    break;
  case 0x8005:
    local_50 = &ompi_mpi_double;
    break;
  default:
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x12f);
    local_50 = &ompi_mpi_byte;
  }
  MPI_Sendrecv(sendbuf,sendcount,mpirecvtype,dest,sendtag,recvbuf,recvcount,local_50,src,recvtag,
               *self->data,0);
  return;
}

Assistant:

static void Sendrecv(IceTCommunicator self,
                     const void *sendbuf,
                     int sendcount,
                     IceTEnum sendtype,
                     int dest,
                     int sendtag,
                     void *recvbuf,
                     int recvcount,
                     IceTEnum recvtype,
                     int src,
                     int recvtag)
{
    MPI_Datatype mpisendtype;
    MPI_Datatype mpirecvtype;
    CONVERT_DATATYPE(sendtype, mpisendtype);
    CONVERT_DATATYPE(recvtype, mpirecvtype);

    MPI_Sendrecv((void *)sendbuf, sendcount, mpisendtype, dest, sendtag,
                 recvbuf, recvcount, mpirecvtype, src, recvtag, MPI_COMM,
                 MPI_STATUS_IGNORE);
}